

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QString * __thiscall
QDir::absoluteFilePath(QString *__return_storage_ptr__,QDir *this,QString *fileName)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  undefined1 local_38 [16];
  QString *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = treatAsAbsolute(fileName);
  if (bVar4) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0021219f:
      __stack_chk_fail();
    }
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&fileName->d);
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QDirPrivate::resolveAbsoluteEntry((QString *)&local_58,(this->d_ptr).d.ptr);
    qVar3 = local_58.size;
    pcVar2 = local_58.ptr;
    pDVar1 = local_58.d;
    if ((fileName->d).size == 0) {
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = pcVar2;
      local_58.size = 0;
      (__return_storage_ptr__->d).size = qVar3;
    }
    else {
      bVar4 = QString::endsWith((QString *)&local_58,(QChar)0x2f,CaseSensitive);
      if (bVar4) {
        local_38._0_8_ = &local_58;
        local_38._8_8_ = fileName;
        QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
                  (__return_storage_ptr__,(QStringBuilder<QString_&,_const_QString_&> *)local_38);
      }
      else {
        local_38._8_2_ = 0x2f;
        local_38._0_8_ = &local_58;
        local_28 = fileName;
        QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                  (__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&> *)local_38)
        ;
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0021219f;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QDir::absoluteFilePath(const QString &fileName) const
{
    if (treatAsAbsolute(fileName))
        return fileName;

    Q_D(const QDir);
    QString absoluteDirPath = d->resolveAbsoluteEntry();
    if (fileName.isEmpty())
        return absoluteDirPath;
#ifdef Q_OS_WIN
    // Handle the "absolute except for drive" case (i.e. \blah not c:\blah):
    if (fileName.startsWith(u'/') || fileName.startsWith(u'\\')) {
        // Combine absoluteDirPath's drive with fileName
        const qsizetype drive = drivePrefixLength(absoluteDirPath);
        if (Q_LIKELY(drive))
            return QStringView{absoluteDirPath}.left(drive) % fileName;

        qWarning("Base directory's drive is not a letter: %s",
                 qUtf8Printable(QDir::toNativeSeparators(absoluteDirPath)));
        return QString();
    }
#endif // Q_OS_WIN
    if (!absoluteDirPath.endsWith(u'/'))
        return absoluteDirPath % u'/' % fileName;
    return absoluteDirPath % fileName;
}